

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDatum.cpp
# Opt level: O0

VRDatumPtr MinVR::CreateVRDatumString(void *pData)

{
  VRDatumPtrRC *extraout_RDX;
  string *in_RSI;
  VRDatum_conflict *in_RDI;
  VRDatumPtr VVar1;
  VRDatumString_conflict *obj;
  undefined4 in_stack_ffffffffffffffb8;
  uint uVar2;
  undefined4 in_stack_ffffffffffffffbc;
  VRDatumPtr *in_stack_ffffffffffffffc0;
  string local_38 [16];
  VRString *in_stack_ffffffffffffffd8;
  VRDatumString *in_stack_ffffffffffffffe0;
  
  operator_new(0x68);
  uVar2 = CONCAT13(1,(int3)in_stack_ffffffffffffffb8);
  std::__cxx11::string::string(local_38,in_RSI);
  VRDatumString::VRDatumString(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  uVar2 = uVar2 & 0xffffff;
  std::__cxx11::string::~string(local_38);
  VRDatumPtr::VRDatumPtr
            (in_stack_ffffffffffffffc0,(VRDatum *)CONCAT44(in_stack_ffffffffffffffbc,uVar2));
  VVar1.reference = extraout_RDX;
  VVar1.pData = in_RDI;
  return VVar1;
}

Assistant:

VRDatumPtr CreateVRDatumString(void *pData) {
  VRDatumString *obj = new VRDatumString(*static_cast<VRString *>(pData));
  return VRDatumPtr(obj);
}